

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

bool __thiscall minihttp::HttpSocket::SendRequest(HttpSocket *this,Request *req,bool enqueue)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string asStack_1d8 [32];
  stringstream r;
  ostream local_1a8 [376];
  
  bVar2 = false;
  if (((req->host)._M_string_length != 0) && (bVar2 = false, req->port != 0)) {
    sVar1 = (req->post).data._M_string_length;
    std::__cxx11::stringstream::stringstream((stringstream *)&r);
    pcVar5 = "POST ";
    if (sVar1 == 0) {
      pcVar5 = "GET ";
    }
    poVar4 = std::operator<<(local_1a8,pcVar5);
    poVar4 = std::operator<<(poVar4,(string *)&req->resource);
    poVar4 = std::operator<<(poVar4," HTTP/1.1");
    std::operator<<(poVar4,"\r\n");
    poVar4 = std::operator<<(local_1a8,"Host: ");
    poVar4 = std::operator<<(poVar4,(string *)&req->host);
    std::operator<<(poVar4,"\r\n");
    if (this->_keep_alive == 0) {
      poVar4 = std::operator<<(local_1a8,"Connection: close");
    }
    else {
      poVar4 = std::operator<<(local_1a8,"Connection: Keep-Alive");
      std::operator<<(poVar4,"\r\n");
      poVar4 = std::operator<<(local_1a8,"Keep-Alive: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    std::operator<<(poVar4,"\r\n");
    if ((this->_user_agent)._M_string_length != 0) {
      poVar4 = std::operator<<(local_1a8,"User-Agent: ");
      poVar4 = std::operator<<(poVar4,(string *)&this->_user_agent);
      std::operator<<(poVar4,"\r\n");
    }
    if ((this->_accept_encoding)._M_string_length != 0) {
      poVar4 = std::operator<<(local_1a8,"Accept-Encoding: ");
      poVar4 = std::operator<<(poVar4,(string *)&this->_accept_encoding);
      std::operator<<(poVar4,"\r\n");
    }
    if (sVar1 != 0) {
      poVar4 = std::operator<<(local_1a8,"Content-Length: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"\r\n");
      poVar4 = std::operator<<(local_1a8,"Content-Type: application/x-www-form-urlencoded");
      std::operator<<(poVar4,"\r\n");
    }
    if ((req->extraGetHeaders)._M_string_length != 0) {
      std::operator<<(local_1a8,(string *)&req->extraGetHeaders);
      iVar3 = std::__cxx11::string::compare
                        ((ulong)&req->extraGetHeaders,(req->extraGetHeaders)._M_string_length - 2,
                         (char *)0xffffffffffffffff);
      if (iVar3 != 0) {
        std::operator<<(local_1a8,"\r\n");
      }
    }
    std::operator<<(local_1a8,"\r\n");
    if (sVar1 != 0) {
      std::operator<<(local_1a8,(string *)&req->post);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&req->header,asStack_1d8);
    std::__cxx11::string::~string(asStack_1d8);
    bVar2 = _EnqueueOrSend(this,req,enqueue);
    std::__cxx11::stringstream::~stringstream((stringstream *)&r);
  }
  return bVar2;
}

Assistant:

bool HttpSocket::SendRequest(Request& req, bool enqueue)
{
    if(req.host.empty() || !req.port)
        return false;

    const bool post = !req.post.empty();

    std::stringstream r;
    const char *crlf = "\r\n";
    r << (post ? "POST " : "GET ") << req.resource << " HTTP/1.1" << crlf;
    r << "Host: " << req.host << crlf;
    if(_keep_alive)
    {
        r << "Connection: Keep-Alive" << crlf;
        r << "Keep-Alive: " << _keep_alive << crlf;
    }
    else
        r << "Connection: close" << crlf;

    if(_user_agent.length())
        r << "User-Agent: " << _user_agent << crlf;

    if(_accept_encoding.length())
        r << "Accept-Encoding: " << _accept_encoding << crlf;

    if(post)
    {
        r << "Content-Length: " << req.post.length() << crlf;
        r << "Content-Type: application/x-www-form-urlencoded" << crlf;
    }

    if(req.extraGetHeaders.length())
    {
        r << req.extraGetHeaders;
        if(req.extraGetHeaders.compare(req.extraGetHeaders.length() - 2, std::string::npos, crlf))
            r << crlf;
    }

    r << crlf; // header terminator

    // FIXME: appending this to the 'header' field is probably not a good idea
    if(post)
        r << req.post.str();

    req.header = r.str();

    return _EnqueueOrSend(req, enqueue);
}